

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void discordpp::from_json(json *j,Interaction *t)

{
  bool bVar1;
  const_reference pvVar2;
  InteractionType *pIVar3;
  runtime_error *this;
  omittable_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  oStack_278;
  _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
  local_260;
  ApplicationCommandData local_138;
  
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[3],_0>(j,(char (*) [3])0x1c65df);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[3],_0>(j,(char (*) [3])0x1c65df);
    from_json(pvVar2,&t->id);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[15],_0>(j,(char (*) [15])0x1c65a2);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[15],_0>(j,(char (*) [15])0x1c65a2);
    from_json(pvVar2,&t->application_id);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(j,(char (*) [5])0x1c22bc);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1c22bc);
    from_json(pvVar2,&t->type);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(j,(char (*) [5])0x1bdd9a);
  if (bVar1) {
    pIVar3 = field<discordpp::InteractionType>::operator*(&t->type);
    switch(*pIVar3) {
    case APPLICATION_COMMAND:
    case APPLICATION_COMMAND_AUTOCOMPLETE:
      pvVar2 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1bdd9a);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<discordpp::ApplicationCommandData,_0>(&local_138,pvVar2);
      std::__detail::__variant::
      _Variant_storage<false,discordpp::ApplicationCommandData,discordpp::MessageComponentData,discordpp::ModalSubmitData>
      ::_Variant_storage<0ul,discordpp::ApplicationCommandData>
                ((_Variant_storage<false,discordpp::ApplicationCommandData,discordpp::MessageComponentData,discordpp::ModalSubmitData>
                  *)&local_260,&local_138);
      omittable_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::omittable_field(&oStack_278,
                        (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
                         *)&local_260);
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::operator=(&(t->data).
                   super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  ,&oStack_278.
                    super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                 );
      std::
      unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
      ::~unique_ptr(&oStack_278.
                     super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                     .t_);
      std::__detail::__variant::
      _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
      ::~_Variant_storage(&local_260);
      ApplicationCommandData::~ApplicationCommandData(&local_138);
      break;
    case MESSAGE_COMPONENT:
      pvVar2 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1bdd9a);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<discordpp::MessageComponentData,_0>(&local_138,pvVar2);
      std::__detail::__variant::
      _Variant_storage<false,discordpp::ApplicationCommandData,discordpp::MessageComponentData,discordpp::ModalSubmitData>
      ::_Variant_storage<1ul,discordpp::MessageComponentData>
                ((_Variant_storage<false,discordpp::ApplicationCommandData,discordpp::MessageComponentData,discordpp::ModalSubmitData>
                  *)&local_260,&local_138);
      omittable_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::omittable_field(&oStack_278,
                        (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
                         *)&local_260);
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::operator=(&(t->data).
                   super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  ,&oStack_278.
                    super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                 );
      std::
      unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
      ::~unique_ptr(&oStack_278.
                     super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                     .t_);
      std::__detail::__variant::
      _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
      ::~_Variant_storage(&local_260);
      MessageComponentData::~MessageComponentData((MessageComponentData *)&local_138);
      break;
    case MODAL_SUBMIT:
      pvVar2 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1bdd9a);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<discordpp::ModalSubmitData,_0>(&local_138,pvVar2);
      std::__detail::__variant::
      _Variant_storage<false,discordpp::ApplicationCommandData,discordpp::MessageComponentData,discordpp::ModalSubmitData>
      ::_Variant_storage<2ul,discordpp::ModalSubmitData>
                ((_Variant_storage<false,discordpp::ApplicationCommandData,discordpp::MessageComponentData,discordpp::ModalSubmitData>
                  *)&local_260,&local_138);
      omittable_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::omittable_field(&oStack_278,
                        (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
                         *)&local_260);
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::operator=(&(t->data).
                   super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  ,&oStack_278.
                    super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                 );
      std::
      unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
      ::~unique_ptr(&oStack_278.
                     super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                     .t_);
      std::__detail::__variant::
      _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
      ::~_Variant_storage(&local_260);
      ModalSubmitData::~ModalSubmitData((ModalSubmitData *)&local_138);
      break;
    default:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown interaction type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[9],_0>(j,(char (*) [9])0x1c65d9);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[9],_0>(j,(char (*) [9])0x1c65d9);
    from_json(pvVar2,&(t->guild_id).super_field<discordpp::Snowflake>);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[11],_0>(j,(char (*) [11])0x1c30aa);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[11],_0>(j,(char (*) [11])0x1c30aa);
    from_json(pvVar2,&(t->channel_id).super_field<discordpp::Snowflake>);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(j,(char (*) [7])"member");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[7],_0>(j,(char (*) [7])"member");
    from_json(pvVar2,&(t->member).super_field<discordpp::GuildMember>);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[5],_0>(j,(char (*) [5])0x1c249f);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1c249f);
    from_json(pvVar2,&(t->user).super_field<discordpp::User>);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[6],_0>(j,(char (*) [6])0x1c5c2d);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[6],_0>(j,(char (*) [6])0x1c5c2d);
    from_json(pvVar2,&t->token);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[8],_0>(j,(char (*) [8])"version");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[8],_0>(j,(char (*) [8])"version");
    from_json(pvVar2,&t->version);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[8],_0>(j,(char (*) [8])0x1c25c8);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[8],_0>(j,(char (*) [8])0x1c25c8);
    from_json(pvVar2,&(t->message).super_field<discordpp::Message>);
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[16],_0>(j,(char (*) [16])"app_permissions");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[16],_0>(j,(char (*) [16])"app_permissions");
    from_json(pvVar2,&(t->app_permissions).
                      super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[7],_0>(j,(char (*) [7])0x1be435);
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[7],_0>(j,(char (*) [7])0x1be435);
    from_json(pvVar2,&(t->locale).
                      super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  }
  bVar1 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[13],_0>(j,(char (*) [13])"guild_locale");
  if (bVar1) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[13],_0>(j,(char (*) [13])"guild_locale");
    from_json(pvVar2,&(t->guild_locale).
                      super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, Interaction &t) {
        if(j.contains("id")){j.at("id").get_to(t.id);}
        if(j.contains("application_id")){j.at("application_id").get_to(t.application_id);}
        if(j.contains("type")){j.at("type").get_to(t.type);}
        if(j.contains("data")){
            switch(*t.type) {
            case InteractionType::APPLICATION_COMMAND:
            case InteractionType::APPLICATION_COMMAND_AUTOCOMPLETE:
                t.data = std::variant<ApplicationCommandData, MessageComponentData, ModalSubmitData>(
                    j.at("data").get<ApplicationCommandData>()
                );
                break;
            case InteractionType::MESSAGE_COMPONENT:
                t.data = std::variant<ApplicationCommandData, MessageComponentData, ModalSubmitData>(
                    j.at("data").get<MessageComponentData>()
                );
                break;
            case InteractionType::MODAL_SUBMIT:
                t.data = std::variant<ApplicationCommandData, MessageComponentData, ModalSubmitData>(
                    j.at("data").get<ModalSubmitData>()
                );
                break;
            default:
                throw std::runtime_error("Unknown interaction type");
            }
        }
        if(j.contains("guild_id")){j.at("guild_id").get_to(t.guild_id);}
        if(j.contains("channel_id")){j.at("channel_id").get_to(t.channel_id);}
        if(j.contains("member")){j.at("member").get_to(t.member);}
        if(j.contains("user")){j.at("user").get_to(t.user);}
        if(j.contains("token")){j.at("token").get_to(t.token);}
        if(j.contains("version")){j.at("version").get_to(t.version);}
        if(j.contains("message")){j.at("message").get_to(t.message);}
        if(j.contains("app_permissions")){j.at("app_permissions").get_to(t.app_permissions);}
        if(j.contains("locale")){j.at("locale").get_to(t.locale);}
        if(j.contains("guild_locale")){j.at("guild_locale").get_to(t.guild_locale);}
    }